

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpuintegration.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26552d::CpuIntegrationTest_nmi_Test::TestBody(CpuIntegrationTest_nmi_Test *this)

{
  allocator<unsigned_char> *this_00;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  bool bVar1;
  pointer pIVar2;
  char *pcVar3;
  AssertHelper local_e8;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  allocator<unsigned_char> local_43;
  uchar local_42 [10];
  iterator local_38;
  size_type local_30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  CpuIntegrationTest_nmi_Test *local_10;
  CpuIntegrationTest_nmi_Test *this_local;
  
  local_42[0] = 0xa2;
  local_42[1] = 0;
  local_42[2] = 0xa0;
  local_42[3] = 0;
  local_42[4] = 0xe8;
  local_42[5] = 0x4c;
  local_42[6] = 4;
  local_42[7] = 6;
  local_42[8] = 0;
  local_42[9] = 0;
  local_38 = local_42;
  local_30 = 10;
  local_10 = this;
  std::allocator<unsigned_char>::allocator(&local_43);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_28,__l_00,&local_43);
  CpuIntegrationTest::load_hex_dump(&this->super_CpuIntegrationTest,0x600,&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
  std::allocator<unsigned_char>::~allocator(&local_43);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = 200;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_1_ = 0x40;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_1_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 0;
  this_00 = (allocator<unsigned_char> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 3);
  std::allocator<unsigned_char>::allocator(this_00);
  __l._M_len = 4;
  __l._M_array = (iterator)
                 ((long)&gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl + 4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_70,__l,this_00);
  CpuIntegrationTest::load_hex_dump(&this->super_CpuIntegrationTest,0x1000,&local_70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_70);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 3));
  CpuIntegrationTest::set_reset_address(&this->super_CpuIntegrationTest,0x600);
  CpuIntegrationTest::set_break_address(&this->super_CpuIntegrationTest,0xdead);
  CpuIntegrationTest::set_nmi_address(&this->super_CpuIntegrationTest,0x1000);
  (this->super_CpuIntegrationTest).expected.x = '\x05';
  (this->super_CpuIntegrationTest).expected.y = '\0';
  (this->super_CpuIntegrationTest).expected.pc = 0x604;
  pIVar2 = std::unique_ptr<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>::
           operator->(&(this->super_CpuIntegrationTest).cpu);
  (*(pIVar2->super_ICpu)._vptr_ICpu[3])();
  CpuIntegrationTest::step_execution(&this->super_CpuIntegrationTest,'\x1d');
  testing::internal::EqHelper::
  Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
            ((EqHelper *)local_98,"expected","registers",&(this->super_CpuIntegrationTest).expected,
             &(this->super_CpuIntegrationTest).registers);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0x126,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  CpuIntegrationTest::step_execution(&this->super_CpuIntegrationTest,'\x04');
  pIVar2 = std::unique_ptr<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>::
           operator->(&(this->super_CpuIntegrationTest).cpu);
  (*(pIVar2->super_ICpu)._vptr_ICpu[5])(pIVar2,1);
  (this->super_CpuIntegrationTest).expected.x = '\x06';
  CpuIntegrationTest::step_execution(&this->super_CpuIntegrationTest,'\x01');
  testing::internal::EqHelper::
  Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
            ((EqHelper *)local_b8,"expected","registers",&(this->super_CpuIntegrationTest).expected,
             &(this->super_CpuIntegrationTest).registers);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0x12f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  (this->super_CpuIntegrationTest).expected.y = '\x01';
  (this->super_CpuIntegrationTest).expected.pc = 0x604;
  (this->super_CpuIntegrationTest).expected.p = (this->super_CpuIntegrationTest).expected.p | 0x20;
  CpuIntegrationTest::step_execution(&this->super_CpuIntegrationTest,'\x0f');
  testing::internal::EqHelper::
  Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
            ((EqHelper *)local_d8,"expected","registers",&(this->super_CpuIntegrationTest).expected,
             &(this->super_CpuIntegrationTest).registers);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0x136,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  return;
}

Assistant:

TEST_F(CpuIntegrationTest, nmi) {
    // Address  Hexdump   Dissassembly
    // -------------------------------
    // $0600    a2 00     LDX #$00
    // $0602    a0 00     LDY #$00
    // $0604    e8        INX
    // $0605    4c 04 06  JMP $0604
    // nmi:
    // $1000    c8        INY
    // $1001    40        RTI
    load_hex_dump(0x0600,
            {0xa2, 0x00, 0xa0, 0x00, 0xe8, 0x4c, 0x04, 0x06, 0x00, 0x00});
    load_hex_dump(0x1000, {0xc8, 0x40, 0x00, 0x00});

    set_reset_address(0x0600);
    set_break_address(0xDEAD);
    set_nmi_address(0x1000);

    expected.x = 0x05;
    expected.y = 0x00;
    expected.pc = 0x0604;

    cpu->reset();
    // Run the loop 5 times to increase x
    step_execution(2 + 2 + (2 + 3) * 5); // ldx + ldy + (inx + jmp) * 5
    EXPECT_EQ(expected, registers);

    // Before jmp is finised, trigger an nmi
    step_execution(2 + 3 - 1); // inx + jmp - 1
    cpu->set_nmi(true);

    // jmp should finish before jumping to nmi
    expected.x = 0x06;
    step_execution(1);
    EXPECT_EQ(expected, registers);

    // Run rti subroutine and jump back
    expected.y = 0x01;
    expected.pc = 0x0604;
    expected.p |= FLAG_5;
    step_execution(7 + 2 + 6); // nmi + iny + rti
    EXPECT_EQ(expected, registers);
}